

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O3

void __thiscall
btAxisSweep3Internal<unsigned_int>::sortMaxUp
          (btAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,btDispatcher *param_3,
          bool updateOverlaps)

{
  int *piVar1;
  uint uVar2;
  Handle *pHVar3;
  btOverlappingPairCallback *pbVar4;
  uint uVar5;
  ulong uVar6;
  Edge EVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  Handle *pHVar11;
  Handle *pHVar12;
  long lVar13;
  Edge *pEVar14;
  bool bVar15;
  
  lVar8 = (long)axis;
  uVar5 = this->m_pEdges[lVar8][(ulong)edge + 1].m_handle;
  if (uVar5 != 0) {
    pEVar14 = this->m_pEdges[lVar8] + edge;
    EVar7.m_handle = 0;
    EVar7.m_pos = pEVar14->m_pos;
    uVar2 = pEVar14->m_handle;
    uVar10 = 1 << ((byte)axis & 0x1f) & 3;
    pHVar3 = this->m_pHandles;
    uVar9 = 1 << (sbyte)uVar10 & 3;
    do {
      if (EVar7.m_pos < pEVar14[1].m_pos) {
        return;
      }
      pHVar11 = this->m_pHandles + uVar5;
      bVar15 = (pEVar14[1].m_pos & 1) == 0;
      lVar13 = 0x48;
      if (bVar15) {
        lVar13 = 0x3c;
      }
      if ((((bVar15 && updateOverlaps) &&
           (lVar13 = 0x3c,
           *(uint *)((long)(&(pHVar11->super_btBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar10 * 4)
                    ) <= *(uint *)((long)pHVar3[uVar2].m_maxEdges + (ulong)(uVar10 * 4)))) &&
          (*(uint *)((long)(&pHVar3[uVar2].super_btBroadphaseProxy.m_aabbMax + 1) +
                    (ulong)(uVar10 * 4)) <=
           *(uint *)((long)pHVar11->m_maxEdges + (ulong)(uVar10 * 4)))) &&
         ((uVar6 = (ulong)(uVar9 * 4),
          *(uint *)((long)(&(pHVar11->super_btBroadphaseProxy).m_aabbMax + 1) + uVar6) <=
          *(uint *)((long)pHVar3[uVar2].m_maxEdges + uVar6) &&
          (uVar6 = (ulong)(uVar9 * 4),
          *(uint *)((long)(&pHVar3[uVar2].super_btBroadphaseProxy.m_aabbMax + 1) + uVar6) <=
          *(uint *)((long)pHVar11->m_maxEdges + uVar6))))) {
        pHVar12 = this->m_pHandles + pEVar14->m_handle;
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[2])
                  (this->m_pairCache,pHVar12,pHVar11);
        pbVar4 = this->m_userPairCallback;
        if (pbVar4 != (btOverlappingPairCallback *)0x0) {
          (*pbVar4->_vptr_btOverlappingPairCallback[2])(pbVar4,pHVar12,pHVar11);
        }
      }
      piVar1 = (int *)((long)(pHVar11->super_btBroadphaseProxy).m_aabbMin.m_floats +
                      lVar8 * 4 + lVar13 + -0x1c);
      *piVar1 = *piVar1 + -1;
      pHVar3[uVar2].m_maxEdges[lVar8] = pHVar3[uVar2].m_maxEdges[lVar8] + 1;
      EVar7 = *pEVar14;
      *pEVar14 = pEVar14[1];
      pEVar14[1] = EVar7;
      uVar5 = pEVar14[2].m_handle;
      pEVar14 = pEVar14 + 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		const int axis1 = (1  << axis) & 3;
		const int axis2 = (1  << axis1) & 3;

		if (!pNext->IsMax())
		{
			// if next edge is a minimum check the bounds and add an overlap if necessary
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandleNext,axis1,axis2))
			{
				Handle* handle0 = getHandle(pEdge->m_handle);
				Handle* handle1 = getHandle(pNext->m_handle);
				m_pairCache->addOverlappingPair(handle0,handle1);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(handle0,handle1);
			}

			// update edge reference in other handle
			pHandleNext->m_minEdges[axis]--;
		}
		else
			pHandleNext->m_maxEdges[axis]--;

		pHandleEdge->m_maxEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}
	
}